

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QRect QDockAreaLayout::constrainedRect(QRect rect,QWidget *widget)

{
  QRect QVar1;
  bool bVar2;
  QRect *this;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QScreen *screen;
  QRect screenRect;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  QRect *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  long local_98;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  undefined1 local_58 [16];
  QPoint local_48;
  QList<QScreen_*> local_40;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  int iStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = 0;
  local_28 = in_RDI;
  uStack_20 = in_RSI;
  QGuiApplication::primaryScreen();
  QScreen::virtualSiblings();
  this = (QRect *)QList<QScreen_*>::size(&local_40);
  QList<QScreen_*>::~QList((QList<QScreen_*> *)0x575f05);
  if (1 < (long)this) {
    local_48 = QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                             );
    local_98 = QGuiApplication::screenAt((QPoint *)&local_48);
  }
  if (local_98 == 0) {
    QWidget::screen((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = QScreen::geometry();
  bVar2 = QRect::isValid(in_stack_ffffffffffffff50);
  if (bVar2) {
    local_5c = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    local_60 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    qMin<int>(&local_5c,&local_60);
    QRect::setWidth(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    local_64 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
    ;
    local_68 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
    ;
    qMin<int>(&local_64,&local_68);
    QRect::setHeight(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    local_6c = QRect::left((QRect *)0x57600e);
    local_70 = QRect::left((QRect *)0x57601c);
    qMax<int>(&local_6c,&local_70);
    QRect::moveLeft(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    local_74 = QRect::top((QRect *)0x57604b);
    local_78 = QRect::top((QRect *)0x576059);
    qMax<int>(&local_74,&local_78);
    QRect::moveTop(this,in_stack_ffffffffffffff5c);
    local_7c = QRect::right((QRect *)0x576088);
    local_80 = QRect::right((QRect *)0x576096);
    qMin<int>(&local_7c,&local_80);
    QRect::moveRight(this,in_stack_ffffffffffffff5c);
    QRect::bottom((QRect *)0x5760c5);
    QRect::bottom((QRect *)0x5760d3);
    qMin<int>((int *)&stack0xffffffffffffff7c,(int *)&stack0xffffffffffffff78);
    QRect::moveBottom(this,in_stack_ffffffffffffff5c);
  }
  local_18 = (undefined4)local_28;
  uStack_14 = local_28._4_4_;
  uStack_10 = (undefined4)uStack_20;
  iStack_c = uStack_20._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar1.x2.m_i = (undefined4)uStack_20;
  QVar1.x1.m_i = (undefined4)local_28;
  QVar1.y1.m_i = local_28._4_4_;
  QVar1.y2.m_i = uStack_20._4_4_;
  return QVar1;
}

Assistant:

QRect QDockAreaLayout::constrainedRect(QRect rect, QWidget* widget)
{
    QScreen *screen = nullptr;
    if (QGuiApplication::primaryScreen()->virtualSiblings().size() > 1)
        screen = QGuiApplication::screenAt(rect.topLeft());
    if (!screen)
        screen = widget->screen();

    const QRect screenRect = screen->geometry();
    if (screenRect.isValid()) {
        rect.setWidth(qMin(rect.width(), screenRect.width()));
        rect.setHeight(qMin(rect.height(), screenRect.height()));
        rect.moveLeft(qMax(rect.left(), screenRect.left()));
        rect.moveTop(qMax(rect.top(), screenRect.top()));
        rect.moveRight(qMin(rect.right(), screenRect.right()));
        rect.moveBottom(qMin(rect.bottom(), screenRect.bottom()));
    }

    return rect;
}